

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O3

QSize __thiscall QtMWidgets::NavigationArrow::minimumSizeHint(NavigationArrow *this)

{
  int iVar1;
  int iVar2;
  QSize QVar3;
  int iVar4;
  
  iVar1 = FingerGeometry::width();
  iVar4 = (int)((double)((ulong)((double)iVar1 / 5.0) & 0x8000000000000000 | (ulong)DAT_00177040) +
               (double)iVar1 / 5.0);
  iVar1 = FingerGeometry::height();
  iVar2 = (int)((double)((ulong)((double)iVar1 / 3.0) & 0x8000000000000000 | (ulong)DAT_00177040) +
               (double)iVar1 / 3.0);
  iVar1 = iVar2;
  if (((this->d).d)->direction - Left < 2) {
    iVar1 = iVar4;
    iVar4 = iVar2;
  }
  QVar3.ht = iVar4;
  QVar3.wd = iVar1;
  return QVar3;
}

Assistant:

QSize
NavigationArrow::minimumSizeHint() const
{
	const int width = qRound( (qreal) FingerGeometry::width() / 5.0 );
	const int height = qRound( (qreal) FingerGeometry::height() / 3.0 );

	return ( ( d->direction == Left || d->direction == Right ) ?
		QSize( width, height ) : QSize( height, width ) );
}